

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

XSAnnotation * __thiscall
xercesc_4_0::TraverseSchema::generateSyntheticAnnotation
          (TraverseSchema *this,DOMElement *elem,ValueVectorOf<xercesc_4_0::DOMNode_*> *nonXSAttList
          )

{
  XMLBuffer *this_00;
  short *psVar1;
  XMLCh XVar2;
  MemoryManager *pMVar3;
  XMLSize_t XVar4;
  XMLSize_t XVar5;
  _func_int **pp_Var6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *pVVar9;
  undefined4 extraout_var_00;
  DOMNode **ppDVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar11;
  TraverseSchema *pTVar12;
  XMLCh *pXVar13;
  XMLCh *pXVar14;
  XMLSize_t XVar15;
  DOMElement *pDVar16;
  undefined4 extraout_var_05;
  XSAnnotation *this_01;
  XMLCh *pXVar17;
  long lVar18;
  XMLCh XVar19;
  XMLCh *attVal;
  XMLSize_t XVar20;
  long lVar21;
  uint local_6c;
  DOMElement *local_68;
  ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *local_60;
  long *local_58;
  ulong local_50;
  XMLCh *local_48;
  DOMElement *local_40;
  long local_38;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  
  local_68 = elem;
  iVar8 = (*(elem->super_DOMNode)._vptr_DOMNode[0x17])(elem);
  pXVar13 = (XMLCh *)CONCAT44(extraout_var,iVar8);
  pVVar9 = (ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new(0x30,this->fMemoryManager);
  pMVar3 = this->fMemoryManager;
  pVVar9->fMemoryManager = pMVar3;
  pVVar9->fBucketList = (ValueHashTableBucketElem<unsigned_int> **)0x0;
  pVVar9->fHashModulus = 0x1d;
  pVVar9->fInitialModulus = 0x1d;
  pVVar9->fCount = 0;
  iVar8 = (*pMVar3->_vptr_MemoryManager[3])();
  pVVar9->fBucketList = (ValueHashTableBucketElem<unsigned_int> **)CONCAT44(extraout_var_00,iVar8);
  memset((ValueHashTableBucketElem<unsigned_int> **)CONCAT44(extraout_var_00,iVar8),0,
         pVVar9->fHashModulus << 3);
  this_00 = &this->fBuffer;
  (this->fBuffer).fIndex = 0;
  if ((this->fBuffer).fCapacity == 0) {
    XMLBuffer::ensureCapacity(this_00,1);
  }
  XVar15 = (this->fBuffer).fIndex;
  (this->fBuffer).fIndex = XVar15 + 1;
  (this->fBuffer).fBuffer[XVar15] = L'<';
  if (pXVar13 != (XMLCh *)0x0) {
    XMLBuffer::append(this_00,pXVar13);
    if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
    }
    XVar15 = (this->fBuffer).fIndex;
    (this->fBuffer).fIndex = XVar15 + 1;
    (this->fBuffer).fBuffer[XVar15] = L':';
  }
  attVal = L"annotation";
  local_60 = pVVar9;
  local_48 = pXVar13;
  XMLBuffer::append(this_00,L"annotation");
  XVar15 = nonXSAttList->fCurCount;
  if (XVar15 != 0) {
    XVar20 = 0;
    do {
      ppDVar10 = ValueVectorOf<xercesc_4_0::DOMNode_*>::elementAt(nonXSAttList,XVar20);
      pTVar12 = (TraverseSchema *)*ppDVar10;
      if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
        XMLBuffer::ensureCapacity(this_00,1);
      }
      XVar4 = (this->fBuffer).fIndex;
      (this->fBuffer).fIndex = XVar4 + 1;
      (this->fBuffer).fBuffer[XVar4] = L' ';
      iVar8 = (*(*(_func_int ***)pTVar12)[2])(pTVar12);
      XMLBuffer::append(this_00,(XMLCh *)CONCAT44(extraout_var_01,iVar8));
      if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
        XMLBuffer::ensureCapacity(this_00,1);
      }
      XVar5 = (this->fBuffer).fIndex;
      XVar4 = XVar5 + 1;
      (this->fBuffer).fIndex = XVar4;
      (this->fBuffer).fBuffer[XVar5] = L'=';
      if (XVar4 == (this->fBuffer).fCapacity) {
        XMLBuffer::ensureCapacity(this_00,1);
      }
      XVar4 = (this->fBuffer).fIndex;
      (this->fBuffer).fIndex = XVar4 + 1;
      (this->fBuffer).fBuffer[XVar4] = L'\"';
      iVar8 = (*(*(_func_int ***)pTVar12)[3])();
      attVal = (XMLCh *)CONCAT44(extraout_var_02,iVar8);
      processAttValue(pTVar12,attVal,this_00);
      if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
        attVal = (XMLCh *)0x1;
        XMLBuffer::ensureCapacity(this_00,1);
      }
      XVar4 = (this->fBuffer).fIndex;
      (this->fBuffer).fIndex = XVar4 + 1;
      (this->fBuffer).fBuffer[XVar4] = L'\"';
      XVar20 = XVar20 + 1;
    } while (XVar15 != XVar20);
  }
  local_50 = 0;
  pDVar16 = local_68;
  do {
    local_40 = pDVar16;
    iVar8 = (*(pDVar16->super_DOMNode)._vptr_DOMNode[0xb])(pDVar16);
    plVar11 = (long *)CONCAT44(extraout_var_03,iVar8);
    local_38 = (**(code **)(*plVar11 + 0x28))(plVar11);
    if (local_38 != 0) {
      lVar21 = 0;
      local_58 = plVar11;
      do {
        pTVar12 = (TraverseSchema *)(**(code **)(*plVar11 + 0x18))(plVar11,lVar21);
        pXVar13 = (XMLCh *)(**(code **)(*(long *)pTVar12 + 0x10))(pTVar12);
        lVar18 = 0;
        do {
          psVar1 = (short *)((long)&XMLUni::fgXMLNSColonString + lVar18);
          lVar18 = lVar18 + 2;
        } while (*psVar1 != 0);
        attVal = L"xmlns:";
        iVar8 = XMLString::compareNString(pXVar13,L"xmlns:",(lVar18 >> 1) - 1);
        pVVar9 = local_60;
        if (iVar8 == 0) {
          attVal = pXVar13;
          bVar7 = ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::containsKey
                            (local_60,pXVar13);
          plVar11 = local_58;
          if (!bVar7) {
            local_6c = 0;
            ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::put(pVVar9,pXVar13,&local_6c)
            ;
            if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
              XMLBuffer::ensureCapacity(this_00,1);
            }
            XVar15 = (this->fBuffer).fIndex;
            (this->fBuffer).fIndex = XVar15 + 1;
            (this->fBuffer).fBuffer[XVar15] = L' ';
            XMLBuffer::append(this_00,pXVar13);
            plVar11 = local_58;
            if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
              XMLBuffer::ensureCapacity(this_00,1);
            }
            XVar20 = (this->fBuffer).fIndex;
            XVar15 = XVar20 + 1;
            (this->fBuffer).fIndex = XVar15;
            (this->fBuffer).fBuffer[XVar20] = L'=';
            if (XVar15 == (this->fBuffer).fCapacity) {
              XMLBuffer::ensureCapacity(this_00,1);
            }
            XVar15 = (this->fBuffer).fIndex;
            (this->fBuffer).fIndex = XVar15 + 1;
            (this->fBuffer).fBuffer[XVar15] = L'\"';
            attVal = (XMLCh *)(**(code **)(*(long *)pTVar12 + 0x18))();
            processAttValue(pTVar12,attVal,this_00);
            XVar15 = (this->fBuffer).fIndex;
LAB_00328c06:
            if (XVar15 == (this->fBuffer).fCapacity) {
              attVal = (XMLCh *)0x1;
              XMLBuffer::ensureCapacity(this_00,1);
            }
            XVar15 = (this->fBuffer).fIndex;
            (this->fBuffer).fIndex = XVar15 + 1;
            (this->fBuffer).fBuffer[XVar15] = L'\"';
          }
        }
        else if ((local_50 & 1) == 0) {
          if (pXVar13 == L"xmlns") {
LAB_00328b4a:
            if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
              XMLBuffer::ensureCapacity(this_00,1);
            }
            XVar15 = (this->fBuffer).fIndex;
            (this->fBuffer).fIndex = XVar15 + 1;
            (this->fBuffer).fBuffer[XVar15] = L' ';
            XMLBuffer::append(this_00,pXVar13);
            if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
              XMLBuffer::ensureCapacity(this_00,1);
            }
            XVar20 = (this->fBuffer).fIndex;
            XVar15 = XVar20 + 1;
            (this->fBuffer).fIndex = XVar15;
            (this->fBuffer).fBuffer[XVar20] = L'=';
            if (XVar15 == (this->fBuffer).fCapacity) {
              XMLBuffer::ensureCapacity(this_00,1);
            }
            XVar15 = (this->fBuffer).fIndex;
            pXVar13 = (this->fBuffer).fBuffer;
            (this->fBuffer).fIndex = XVar15 + 1;
            pXVar13[XVar15] = L'\"';
            attVal = (XMLCh *)(**(code **)(*(long *)pTVar12 + 0x18))();
            processAttValue(pTVar12,attVal,this_00);
            XVar15 = (this->fBuffer).fIndex;
            local_50 = CONCAT71((int7)((ulong)pXVar13 >> 8),1);
            goto LAB_00328c06;
          }
          pXVar14 = L"xmlns";
          if (pXVar13 == (XMLCh *)0x0) {
LAB_00328b40:
            if (*pXVar14 == L'\0') goto LAB_00328b4a;
          }
          else {
            pXVar14 = L"xmlns";
            pXVar17 = pXVar13;
            do {
              XVar2 = *pXVar17;
              if (XVar2 == L'\0') goto LAB_00328b40;
              pXVar17 = pXVar17 + 1;
              attVal = pXVar14 + 1;
              XVar19 = *pXVar14;
              pXVar14 = attVal;
            } while (XVar2 == XVar19);
          }
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != local_38);
    }
    iVar8 = (*(local_40->super_DOMNode)._vptr_DOMNode[5])();
    pDVar16 = (DOMElement *)CONCAT44(extraout_var_04,iVar8);
    iVar8 = (*(this->fSchemaInfo->fSchemaRootElement->super_DOMNode)._vptr_DOMNode[5])();
    pVVar9 = local_60;
  } while (pDVar16 != (DOMElement *)CONCAT44(extraout_var_05,iVar8));
  ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::~ValueHashTableOf(local_60);
  XMemory::operator_delete((XMemory *)pVVar9,attVal);
  if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
  }
  pXVar13 = local_48;
  XVar20 = (this->fBuffer).fIndex;
  XVar15 = XVar20 + 1;
  (this->fBuffer).fIndex = XVar15;
  (this->fBuffer).fBuffer[XVar20] = L'>';
  if (XVar15 == (this->fBuffer).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
  }
  XVar20 = (this->fBuffer).fIndex;
  XVar15 = XVar20 + 1;
  (this->fBuffer).fIndex = XVar15;
  (this->fBuffer).fBuffer[XVar20] = L'\n';
  if (XVar15 == (this->fBuffer).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
  }
  XVar15 = (this->fBuffer).fIndex;
  (this->fBuffer).fIndex = XVar15 + 1;
  (this->fBuffer).fBuffer[XVar15] = L'<';
  if (pXVar13 == (XMLCh *)0x0) {
    XMLBuffer::append(this_00,L"documentation");
    if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
    }
    XVar15 = (this->fBuffer).fIndex;
    (this->fBuffer).fIndex = XVar15 + 1;
    (this->fBuffer).fBuffer[XVar15] = L'>';
    XMLBuffer::append(this_00,(XMLCh *)fgSynthetic_Annotation);
    if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
    }
    XVar20 = (this->fBuffer).fIndex;
    XVar15 = XVar20 + 1;
    (this->fBuffer).fIndex = XVar15;
    (this->fBuffer).fBuffer[XVar20] = L'<';
    XVar19 = L'/';
    XVar2 = L'/';
    if (XVar15 != (this->fBuffer).fCapacity) goto LAB_00328e22;
  }
  else {
    XMLBuffer::append(this_00,pXVar13);
    if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
    }
    XVar15 = (this->fBuffer).fIndex;
    (this->fBuffer).fIndex = XVar15 + 1;
    (this->fBuffer).fBuffer[XVar15] = L':';
    XMLBuffer::append(this_00,L"documentation");
    if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
    }
    XVar15 = (this->fBuffer).fIndex;
    (this->fBuffer).fIndex = XVar15 + 1;
    (this->fBuffer).fBuffer[XVar15] = L'>';
    XMLBuffer::append(this_00,(XMLCh *)fgSynthetic_Annotation);
    if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
    }
    XVar20 = (this->fBuffer).fIndex;
    XVar15 = XVar20 + 1;
    (this->fBuffer).fIndex = XVar15;
    (this->fBuffer).fBuffer[XVar20] = L'<';
    if (XVar15 == (this->fBuffer).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
    }
    XVar15 = (this->fBuffer).fIndex;
    (this->fBuffer).fIndex = XVar15 + 1;
    (this->fBuffer).fBuffer[XVar15] = L'/';
    XMLBuffer::append(this_00,pXVar13);
    XVar19 = L':';
    XVar2 = L':';
    if ((this->fBuffer).fIndex != (this->fBuffer).fCapacity) goto LAB_00328e22;
  }
  XVar19 = XVar2;
  XMLBuffer::ensureCapacity(this_00,1);
LAB_00328e22:
  XVar15 = (this->fBuffer).fIndex;
  (this->fBuffer).fIndex = XVar15 + 1;
  (this->fBuffer).fBuffer[XVar15] = XVar19;
  XMLBuffer::append(this_00,L"documentation");
  if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
  }
  XVar20 = (this->fBuffer).fIndex;
  XVar15 = XVar20 + 1;
  (this->fBuffer).fIndex = XVar15;
  (this->fBuffer).fBuffer[XVar20] = L'>';
  if (XVar15 == (this->fBuffer).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
  }
  XVar20 = (this->fBuffer).fIndex;
  XVar15 = XVar20 + 1;
  (this->fBuffer).fIndex = XVar15;
  (this->fBuffer).fBuffer[XVar20] = L'\n';
  if (XVar15 == (this->fBuffer).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
  }
  XVar20 = (this->fBuffer).fIndex;
  XVar15 = XVar20 + 1;
  (this->fBuffer).fIndex = XVar15;
  (this->fBuffer).fBuffer[XVar20] = L'<';
  if (XVar15 == (this->fBuffer).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
  }
  XVar15 = (this->fBuffer).fIndex;
  (this->fBuffer).fIndex = XVar15 + 1;
  (this->fBuffer).fBuffer[XVar15] = L'/';
  if (pXVar13 != (XMLCh *)0x0) {
    XMLBuffer::append(this_00,pXVar13);
    if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
    }
    XVar15 = (this->fBuffer).fIndex;
    (this->fBuffer).fIndex = XVar15 + 1;
    (this->fBuffer).fBuffer[XVar15] = L':';
  }
  XMLBuffer::append(this_00,L"annotation");
  if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
  }
  XVar15 = (this->fBuffer).fIndex;
  (this->fBuffer).fIndex = XVar15 + 1;
  (this->fBuffer).fBuffer[XVar15] = L'>';
  this_01 = (XSAnnotation *)XMemory::operator_new(0x58,this->fGrammarPoolMemoryManager);
  pXVar13 = (this->fBuffer).fBuffer;
  pXVar13[(this->fBuffer).fIndex] = L'\0';
  XSAnnotation::XSAnnotation(this_01,pXVar13,this->fGrammarPoolMemoryManager);
  pp_Var6 = local_68[0x17].super_DOMNode._vptr_DOMNode;
  this_01->fLine = (XMLFileLoc)local_68[0x16].super_DOMNode._vptr_DOMNode;
  this_01->fCol = (XMLFileLoc)pp_Var6;
  XSAnnotation::setSystemId(this_01,this->fSchemaInfo->fCurrentSchemaURL);
  return this_01;
}

Assistant:

XSAnnotation* TraverseSchema::generateSyntheticAnnotation(const DOMElement* const elem
                                             , ValueVectorOf<DOMNode*>* nonXSAttList)
{
    const XMLCh* prefix = elem->getPrefix();
    ValueHashTableOf<unsigned int>* listOfURIs = new (fMemoryManager) ValueHashTableOf<unsigned int>(29, fMemoryManager);
    bool sawXMLNS = false;

    fBuffer.reset();
    fBuffer.append(chOpenAngle);
    if (prefix)
    {
        fBuffer.append(prefix);
        fBuffer.append(chColon);
    }
    fBuffer.append(SchemaSymbols::fgELT_ANNOTATION);

    // next is the nonXSAttList names & values
    XMLSize_t nonXSAttSize = nonXSAttList->size();

    for (XMLSize_t i=0; i<nonXSAttSize; i++)
    {
        DOMNode* attNode = nonXSAttList->elementAt(i);

        fBuffer.append(chSpace);
        fBuffer.append(attNode->getNodeName());
        fBuffer.append(chEqual);
        fBuffer.append(chDoubleQuote);
        processAttValue(attNode->getNodeValue(), fBuffer);
        fBuffer.append(chDoubleQuote);
    }

    // next is the namespaces on the elem
    DOMElement* currentElem = (DOMElement*) elem;
    DOMNamedNodeMap* eltAttrs;
    XMLSize_t     attrCount;
    do {
        eltAttrs = currentElem->getAttributes();
        attrCount = eltAttrs->getLength();
        for (XMLSize_t j = 0; j < attrCount; j++)
        {
            DOMNode*     attribute = eltAttrs->item(j);
            const XMLCh* attName = attribute->getNodeName();

            if (XMLString::startsWith(attName, XMLUni::fgXMLNSColonString))
            {
                if (!listOfURIs->containsKey((void*) attName)) {
                    listOfURIs->put((void*) attName, 0);
                    fBuffer.append(chSpace);
                    fBuffer.append(attName);
                    fBuffer.append(chEqual);
                    fBuffer.append(chDoubleQuote);
                    processAttValue(attribute->getNodeValue(), fBuffer);
                    fBuffer.append(chDoubleQuote);
                }
            }
            else if (!sawXMLNS && XMLString::equals(attName, XMLUni::fgXMLNSString))
            {
                fBuffer.append(chSpace);
                fBuffer.append(attName);
                fBuffer.append(chEqual);
                fBuffer.append(chDoubleQuote);
                processAttValue(attribute->getNodeValue(), fBuffer);
                fBuffer.append(chDoubleQuote);
                sawXMLNS = true;
            }
        }
        currentElem = (DOMElement*) currentElem->getParentNode();
    }
    while (currentElem != fSchemaInfo->getRoot()->getParentNode());
    delete listOfURIs;

    fBuffer.append(chCloseAngle);
    fBuffer.append(chLF);
    fBuffer.append(chOpenAngle);
    if (prefix)
    {
        fBuffer.append(prefix);
        fBuffer.append(chColon);
    }
    fBuffer.append(SchemaSymbols::fgELT_DOCUMENTATION);
    fBuffer.append(chCloseAngle);
    fBuffer.append(fgSynthetic_Annotation);
    fBuffer.append(chOpenAngle);
    fBuffer.append(chForwardSlash);
    if (prefix)
    {
        fBuffer.append(prefix);
        fBuffer.append(chColon);
    }
    fBuffer.append(SchemaSymbols::fgELT_DOCUMENTATION);
    fBuffer.append(chCloseAngle);
    fBuffer.append(chLF);
    fBuffer.append(chOpenAngle);
    fBuffer.append(chForwardSlash);
    if (prefix)
    {
        fBuffer.append(prefix);
        fBuffer.append(chColon);
    }
    fBuffer.append(SchemaSymbols::fgELT_ANNOTATION);
    fBuffer.append(chCloseAngle);

    XSAnnotation* annot = new (fGrammarPoolMemoryManager) XSAnnotation(fBuffer.getRawBuffer(), fGrammarPoolMemoryManager);
    annot->setLineCol( ((XSDElementNSImpl*)elem)->getLineNo()
                     , ((XSDElementNSImpl*)elem)->getColumnNo() );
    annot->setSystemId(fSchemaInfo->getCurrentSchemaURL());
    return annot;
}